

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::element_implied_length_metrics_dim<3>(Omega_h *this,Mesh *mesh)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  LO LVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  Reals RVar6;
  Write<double> out;
  type f;
  Reals coords;
  LOs ev2v;
  Reals sizes;
  Write<double> local_a8;
  type local_90;
  Write<double> local_60;
  Alloc *local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  Mesh::ask_elem_verts((Mesh *)&local_40);
  Mesh::coords((Mesh *)&local_50);
  Mesh::ask_sizes((Mesh *)&local_30);
  LVar4 = Mesh::nelems(mesh);
  local_90.ev2v.write_.shared_alloc_.alloc = (Alloc *)&local_90.coords;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  Write<double>::Write(&local_a8,LVar4 * 6,(string *)&local_90);
  if (local_90.ev2v.write_.shared_alloc_.alloc != (Alloc *)&local_90.coords) {
    operator_delete(local_90.ev2v.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_90.coords.write_.shared_alloc_.alloc)->size + 1));
  }
  local_90.ev2v.write_.shared_alloc_.alloc = (Alloc *)local_40._M_pi;
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.ev2v.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_40._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_90.ev2v.write_.shared_alloc_.direct_ptr = local_38;
  local_90.coords.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.coords.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_90.coords.write_.shared_alloc_.direct_ptr = local_48;
  local_90.out.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_90.out.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.out.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
  LVar4 = Mesh::nelems(mesh);
  parallel_for<Omega_h::element_implied_length_metrics_dim<3>(Omega_h::Mesh*)::_lambda(int)_1_>
            (LVar4,&local_90,"element_implied_length_metrics");
  local_60.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
  local_60.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
  if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
       local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
    local_60.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_a8.shared_alloc_.alloc = (Alloc *)0x0;
  local_a8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_60);
  pAVar3 = local_60.shared_alloc_.alloc;
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_60.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  element_implied_length_metrics_dim<3>(Omega_h::Mesh*)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&local_90);
  pAVar3 = local_a8.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  if (((ulong)local_30._M_pi & 7) == 0 && (Alloc *)local_30._M_pi != (Alloc *)0x0) {
    p_Var2 = local_30._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_30._M_pi);
      operator_delete(local_30._M_pi,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    p_Var2 = local_40._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_40._M_pi);
      operator_delete(local_40._M_pi,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals element_implied_length_metrics_dim(Mesh* mesh) {
  auto ev2v = mesh->ask_elem_verts();
  auto coords = mesh->coords();
  auto sizes = mesh->ask_sizes();
  auto out = Write<Real>(mesh->nelems() * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto v = gather_verts<dim + 1>(ev2v, e);
    auto p = gather_vectors<dim + 1, dim>(coords, v);
    auto m = element_implied_metric(p);
    set_symm(out, e, m);
  };
  parallel_for(mesh->nelems(), f, "element_implied_length_metrics");
  return out;
}